

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

bool output_buffer(DESCRIPTOR_DATA *d)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  long in_RDI;
  int o_color;
  int color;
  bool color_code;
  bool ok;
  bool act;
  bool o_bold;
  bool bold;
  bool o_flash;
  bool flash;
  char *point;
  char *i;
  char *str;
  char buf2 [128];
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffed08;
  bool local_12e9;
  ulong in_stack_ffffffffffffed20;
  int length;
  undefined4 in_stack_ffffffffffffed28;
  int in_stack_ffffffffffffed2c;
  int desc;
  char *in_stack_ffffffffffffed30;
  bool local_12b6;
  char *local_12b0;
  char *local_12a8;
  char *local_12a0;
  char local_1298 [128];
  char local_1218 [4616];
  long local_10;
  
  local_12b6 = true;
  if (in_RDI == 0) {
    return false;
  }
  local_10 = in_RDI;
  memset(local_1218,0,0x1200);
  local_12b0 = local_1218;
  local_12a0 = *(char **)(local_10 + 0x6c40);
  do {
    desc = (int)in_stack_ffffffffffffed30;
    length = (int)(in_stack_ffffffffffffed20 >> 0x20);
    bVar3 = false;
    if (*local_12a0 != '\0') {
      bVar3 = (long)local_12a0 - *(long *)(local_10 + 0x6c40) < (long)*(int *)(local_10 + 0x6c4c);
    }
    if (!bVar3) goto LAB_005b0607;
    if (0x11df < (int)local_12b0 - (int)local_1218) {
      *local_12b0 = '\0';
      in_stack_ffffffffffffed2c = (int)*(short *)(local_10 + 0x30);
      in_stack_ffffffffffffed30 = local_1218;
      strlen(local_1218);
      local_12b6 = write_to_descriptor((int)in_stack_ffffffffffffed30,
                                       (char *)CONCAT44(in_stack_ffffffffffffed2c,
                                                        in_stack_ffffffffffffed28),
                                       (int)(in_stack_ffffffffffffed20 >> 0x20));
      desc = (int)in_stack_ffffffffffffed30;
      length = (int)(in_stack_ffffffffffffed20 >> 0x20);
      local_12b0 = local_12b0 + 1;
      if (!local_12b6) {
LAB_005b0607:
        *local_12b0 = '\0';
        local_12e9 = false;
        if (local_12b6 != false) {
          strlen(local_1218);
          local_12e9 = write_to_descriptor(desc,(char *)CONCAT44(in_stack_ffffffffffffed2c,
                                                                 in_stack_ffffffffffffed28),length);
        }
        *(undefined4 *)(local_10 + 0x6c4c) = 0;
        return local_12e9;
      }
      memset(local_1218,0,0x1200);
      local_12b0 = local_1218;
    }
    if (*local_12a0 == '{') {
      bVar3 = false;
      in_stack_ffffffffffffed20 = (ulong)((int)local_12a0[1] - 0x2d);
      switch(in_stack_ffffffffffffed20) {
      case 0:
        sprintf(local_1298,"~");
        break;
      default:
        sprintf(local_1298,"{%c",(ulong)(uint)(int)local_12a0[1]);
        break;
      case 3:
        bVar3 = true;
        break;
      case 4:
        bVar3 = true;
        break;
      case 5:
        bVar3 = true;
        break;
      case 6:
        bVar3 = true;
        break;
      case 7:
        bVar3 = true;
        break;
      case 8:
        bVar3 = true;
        break;
      case 9:
        bVar3 = true;
        break;
      case 10:
        bVar3 = true;
        break;
      case 0xf:
        bVar3 = true;
        break;
      case 0x15:
        bVar3 = true;
        break;
      case 0x19:
        bVar3 = true;
        break;
      case 0x35:
        bVar3 = true;
        break;
      case 0x39:
        bVar3 = true;
        break;
      case 0x41:
        if ((*(long *)(local_10 + 0x10) == 0) ||
           (bVar2 = is_ansi(in_stack_ffffffffffffed08), !bVar2)) {
          local_1298[0] = '\0';
        }
        else {
          sprintf(local_1298,"%s","\x1b[m");
        }
        break;
      case 0x4b:
        sprintf(local_1298,"{");
      }
      if (bVar3) {
        if ((*(long *)(local_10 + 0x10) == 0) ||
           (bVar3 = is_ansi(in_stack_ffffffffffffed08), !bVar3)) {
          local_1298[0] = '\0';
        }
        else {
          pcVar4 = color_value_string(0,false,true);
          sprintf(local_1298,"%s",pcVar4);
        }
      }
      local_12a0 = local_12a0 + 2;
      for (local_12a8 = local_1298; cVar1 = *local_12a8, *local_12b0 = cVar1, cVar1 != '\0';
          local_12a8 = local_12a8 + 1) {
        local_12b0 = local_12b0 + 1;
      }
    }
    else {
      *local_12b0 = *local_12a0;
      local_12b0 = local_12b0 + 1;
      local_12a0 = local_12a0 + 1;
    }
  } while( true );
}

Assistant:

bool output_buffer(DESCRIPTOR_DATA *d)
{
	char buf[MAX_STRING_LENGTH];
	char buf2[128];
	const char *str;
	char *i;
	char *point;
	bool flash= false, o_flash, bold= false, o_bold;
	bool act= false, ok = true, color_code= false;
	int color = 7, o_color;

	/* discard nullptr descriptor */
	if (d == nullptr)
		return false;

	memset(buf, '\0', MAX_STRING_LENGTH);
	point = buf;
	str = d->outbuf;
	o_color = color;
	o_bold = bold;
	o_flash = flash;

	while (*str != '\0' && (str - d->outbuf) < d->outtop)
	{
		if ((int)(point - buf) >= MAX_STRING_LENGTH - 32)
		{
			/* buffer is full, so send it through the socket */
			*point++ = '\0';

			if (!(ok = write_to_descriptor(d->descriptor, buf, strlen(buf))))
				break;

			memset(buf, '\0', MAX_STRING_LENGTH);
			point = buf;
		}

		if (*str != '{')
		{
			color_code= false;
			*point++ = *str++;
			continue;
		}

		if (!color_code && *(str + 1) != '<')
		{
			o_color = color;
			o_bold = bold;
			o_flash = flash;
		}

		color_code = true;
		act= false;
		str++;

		switch (*str)
		{
			case 'x':
				sprintf(buf2, "{");
				break;
			case '-':
				sprintf(buf2, "~");
				break;
			case '<':
				color = o_color;
				bold = o_bold;
				flash = o_flash;
				act = true;
				break;
			case '0':
				color = 0;
				act = true;
				break;
			case '1':
				color = 1;
				act = true;
				break;
			case '2':
				color = 2;
				act = true;
				break;
			case '3':
				color = 3;
				act = true;
				break;
			case '4':
				color = 4;
				act = true;
				break;
			case '5':
				color = 5;
				act = true;
				break;
			case '6':
				color = 6;
				act = true;
				break;
			case '7':
				color = 7;
				act = true;
				break;
			case 'B':
				bold = true;
				act = true;
				break;
			case 'b':
				bold= false;
				act = true;
				break;
			case 'F':
				flash = true;
				act = true;
				break;
			case 'f':
				flash= false;
				act = true;
				break;
			case 'n':
				if (d->character && is_ansi(d->character))
					sprintf(buf2, "%s", ANSI_NORMAL);
				else
					buf2[0] = '\0';

				bold= false;
				color = 7;
				flash= false;
				break;
			default:
				sprintf(buf2, "{%c", *str);
				break;
		}

		if (act)
		{
			if (d->character && is_ansi(d->character))
			{
				sprintf(buf2, "%s", color_value_string(color, bold, flash));
				color_code = true;
			}
			else
			{
				buf2[0] = '\0';
			}
		}

		i = buf2;
		str++;
		while ((*point = *i) != '\0')
		{
			++point, ++i;
		}
	}

	*point++ = '\0';
	ok = ok && (write_to_descriptor(d->descriptor, buf, strlen(buf)));
	d->outtop = 0;

	return ok;
}